

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemRecord.cpp
# Opt level: O0

void * operator_new__(size_t nSize,char *fileName,int lineName)

{
  void *ptr_00;
  char *pcVar1;
  MemRecordMap *this;
  ostream *this_00;
  allocator local_49;
  string local_48 [32];
  void *local_28;
  void *ptr;
  char *pcStack_18;
  int lineName_local;
  char *fileName_local;
  size_t nSize_local;
  
  ptr._4_4_ = lineName;
  pcStack_18 = fileName;
  fileName_local = (char *)nSize;
  local_28 = malloc(nSize);
  this = MemRecordMap::getInstance();
  pcVar1 = pcStack_18;
  ptr_00 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar1,&local_49);
  MemRecordMap::insertMap(this,ptr_00,(string *)local_48,ptr._4_4_);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  this_00 = std::operator<<((ostream *)&std::cout,"call new[]");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return local_28;
}

Assistant:

void* operator new[](size_t nSize , char* fileName , int lineName){
    void* ptr = malloc(nSize);
    MemRecordMap::getInstance()->insertMap(ptr,fileName,lineName);
    std::cout<<"call new[]"<<std::endl;
    return ptr;
}